

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_column_schema.hpp
# Opt level: O3

void __thiscall duckdb::ParquetColumnSchema::~ParquetColumnSchema(ParquetColumnSchema *this)

{
  pointer pcVar1;
  
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&(this->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  LogicalType::~LogicalType(&this->type);
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ParquetColumnSchema() = default;